

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiInputTextFlags InputScalar_DefaultCharsFilter(ImGuiDataType data_type,char *format)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0x20000;
  if ((data_type & 0xfffffffeU) != 8) {
    if (*format == '\0') {
      iVar1 = 1;
    }
    else {
      sVar2 = strlen(format);
      iVar1 = ((format[sVar2 - 1] & 0xdfU) == 0x58) + 1;
    }
  }
  return iVar1;
}

Assistant:

static inline ImGuiInputTextFlags InputScalar_DefaultCharsFilter(ImGuiDataType data_type, const char* format)
{
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        return ImGuiInputTextFlags_CharsScientific;
    const char format_last_char = format[0] ? format[strlen(format) - 1] : 0;
    return (format_last_char == 'x' || format_last_char == 'X') ? ImGuiInputTextFlags_CharsHexadecimal : ImGuiInputTextFlags_CharsDecimal;
}